

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::split_program_name
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *commandline)

{
  byte __rhs;
  string *str;
  path_type pVar1;
  ulong uVar2;
  long lVar3;
  char cVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *str_00;
  bool bVar5;
  allocator local_e1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e0;
  string local_d8;
  string *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  local_e0 = __return_storage_ptr__;
  trim(commandline);
  local_b8 = &__return_storage_ptr__->second;
  cVar4 = (char)commandline;
  uVar2 = ::std::__cxx11::string::find(cVar4,0x20);
  do {
    ::std::__cxx11::string::substr((ulong)&local_d8,(ulong)commandline);
    pVar1 = check_path(local_d8._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_d8);
    str_00 = local_e0;
    if (pVar1 == file) goto LAB_0017ea66;
    uVar2 = ::std::__cxx11::string::find(cVar4,0x20);
    str_00 = local_e0;
  } while (uVar2 != 0xffffffffffffffff);
  __rhs = *(commandline->_M_dataplus)._M_p;
  if ((__rhs - 0x22 < 0x3f) && ((0x4000000000000021U >> ((ulong)(__rhs - 0x22) & 0x3f) & 1) != 0)) {
    bVar5 = false;
    while (lVar3 = ::std::__cxx11::string::find(cVar4,(ulong)(uint)(int)(char)__rhs), lVar3 != -1) {
      if ((commandline->_M_dataplus)._M_p[lVar3 + -1] != '\\') {
        ::std::__cxx11::string::substr((ulong)&local_d8,(ulong)commandline);
        ::std::__cxx11::string::operator=((string *)str_00,(string *)&local_d8);
        ::std::__cxx11::string::~string((string *)&local_d8);
        uVar2 = lVar3 + 1;
        if (bVar5) {
          ::std::__cxx11::string::string((string *)&local_50,(string *)str_00);
          ::std::__cxx11::string::string((string *)&local_90,"\\",&local_e1);
          ::std::operator+(&local_70,&local_90,__rhs);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          ::std::__cxx11::string::_M_construct((ulong)&local_b0,'\x01');
          find_and_replace(&local_d8,&local_50,&local_70,&local_b0);
          ::std::__cxx11::string::operator=((string *)str_00,(string *)&local_d8);
          ::std::__cxx11::string::~string((string *)&local_d8);
          ::std::__cxx11::string::~string((string *)&local_b0);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_90);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        goto LAB_0017ea66;
      }
      bVar5 = true;
    }
    uVar2 = ::std::__cxx11::string::find(cVar4,0x20);
  }
  else {
    uVar2 = ::std::__cxx11::string::find(cVar4,0x20);
    str_00 = local_e0;
  }
LAB_0017ea66:
  if ((str_00->first)._M_string_length == 0) {
    ::std::__cxx11::string::substr((ulong)&local_d8,(ulong)commandline);
    ::std::__cxx11::string::operator=((string *)str_00,(string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    rtrim(&str_00->first);
  }
  if (uVar2 < commandline->_M_string_length - 1) {
    ::std::__cxx11::string::substr((ulong)&local_d8,(ulong)commandline);
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
  }
  str = local_b8;
  ::std::__cxx11::string::operator=((string *)local_b8,(string *)&local_d8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ltrim(str);
  return str_00;
}

Assistant:

CLI11_INLINE std::pair<std::string, std::string> split_program_name(std::string commandline) {
    // try to determine the programName
    std::pair<std::string, std::string> vals;
    trim(commandline);
    auto esp = commandline.find_first_of(' ', 1);
    while(detail::check_path(commandline.substr(0, esp).c_str()) != path_type::file) {
        esp = commandline.find_first_of(' ', esp + 1);
        if(esp == std::string::npos) {
            // if we have reached the end and haven't found a valid file just assume the first argument is the
            // program name
            if(commandline[0] == '"' || commandline[0] == '\'' || commandline[0] == '`') {
                bool embeddedQuote = false;
                auto keyChar = commandline[0];
                auto end = commandline.find_first_of(keyChar, 1);
                while((end != std::string::npos) && (commandline[end - 1] == '\\')) {  // deal with escaped quotes
                    end = commandline.find_first_of(keyChar, end + 1);
                    embeddedQuote = true;
                }
                if(end != std::string::npos) {
                    vals.first = commandline.substr(1, end - 1);
                    esp = end + 1;
                    if(embeddedQuote) {
                        vals.first = find_and_replace(vals.first, std::string("\\") + keyChar, std::string(1, keyChar));
                    }
                } else {
                    esp = commandline.find_first_of(' ', 1);
                }
            } else {
                esp = commandline.find_first_of(' ', 1);
            }

            break;
        }
    }
    if(vals.first.empty()) {
        vals.first = commandline.substr(0, esp);
        rtrim(vals.first);
    }

    // strip the program name
    vals.second = (esp < commandline.length() - 1) ? commandline.substr(esp + 1) : std::string{};
    ltrim(vals.second);
    return vals;
}